

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

bool __thiscall MotionTrajectory::AddConstantVel(MotionTrajectory *this,double pEnd,bool isInfinite)

{
  double *pdVar1;
  pointer *pppMVar2;
  double dVar3;
  pointer ppMVar4;
  iterator __position;
  ConstantVel *this_00;
  MotionBase *prevMotion;
  MotionBase *motion;
  ConstantVel *local_30;
  double local_28;
  
  ppMVar4 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar4 ==
      (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    prevMotion = (MotionBase *)0x0;
  }
  else {
    prevMotion = ppMVar4[-1];
  }
  local_28 = pEnd;
  this_00 = (ConstantVel *)operator_new(0x48);
  ConstantVel::ConstantVel(this_00,local_28,isInfinite,prevMotion);
  dVar3 = (this_00->super_MotionBase).tf;
  pdVar1 = &(this_00->super_MotionBase).t0;
  local_30 = this_00;
  if ((dVar3 != *pdVar1) || (NAN(dVar3) || NAN(*pdVar1))) {
    __position._M_current =
         (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<MotionBase*,std::allocator<MotionBase*>>::_M_realloc_insert<MotionBase*const&>
                ((vector<MotionBase*,std::allocator<MotionBase*>> *)this,__position,
                 (MotionBase **)&local_30);
    }
    else {
      *__position._M_current = (MotionBase *)this_00;
      pppMVar2 = &(this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppMVar2 = *pppMVar2 + 1;
    }
  }
  return (bool)(-((local_30->super_MotionBase).t0 != (local_30->super_MotionBase).tf) & 1);
}

Assistant:

bool MotionTrajectory::AddConstantVel(double pEnd, bool isInfinite)
{
    const MotionBase *prevMotion = GetLastMotion();
    MotionBase *motion = new ConstantVel(pEnd, isInfinite, prevMotion);
    if (motion->IsOK())
        motionList.push_back(motion);
    return motion->IsOK();
}